

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.hpp
# Opt level: O0

void __thiscall libtorrent::aux::tracker_response::tracker_response(tracker_response *this)

{
  int local_28 [5];
  int local_14;
  tracker_response *local_10;
  tracker_response *this_local;
  
  local_10 = this;
  ::std::vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>::vector
            (&this->peers);
  ::std::vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
  ::vector(&this->peers4);
  ::std::vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
  ::vector(&this->peers6);
  ::std::vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>::
  vector(&this->i2p_peers);
  boost::asio::ip::address::address(&this->external_ip);
  ::std::__cxx11::string::string((string *)&this->trackerid);
  ::std::__cxx11::string::string((string *)&this->failure_reason);
  ::std::__cxx11::string::string((string *)&this->warning_message);
  local_14 = 0x708;
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&this->interval,&local_14);
  local_28[0] = 1;
  ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
            ((duration<int,std::ratio<1l,1l>> *)&this->min_interval,local_28);
  this->complete = -1;
  this->incomplete = -1;
  this->downloaders = -1;
  this->downloaded = -1;
  return;
}

Assistant:

tracker_response()
			: interval(1800)
			, min_interval(1)
			, complete(-1)
			, incomplete(-1)
			, downloaders(-1)
			, downloaded(-1)
		{}